

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O3

bool __thiscall cmFileLockPool::IsAlreadyLocked(cmFileLockPool *this,string *filename)

{
  ScopePool *pSVar1;
  bool bVar2;
  pointer ppSVar3;
  pointer ppcVar4;
  pointer ppSVar5;
  pointer ppcVar6;
  
  ppSVar3 = (this->FunctionScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar5 = (this->FunctionScopes).
                 super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar5 != ppSVar3;
      ppSVar5 = ppSVar5 + 1) {
    pSVar1 = *ppSVar5;
    ppcVar4 = (pSVar1->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppcVar4 !=
        (pSVar1->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        bVar2 = cmFileLock::IsLocked(*ppcVar4,filename);
        if (bVar2) {
          return true;
        }
        ppcVar4 = ppcVar4 + 1;
      } while (ppcVar4 !=
               (pSVar1->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
      ppSVar3 = (this->FunctionScopes).
                super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  ppSVar5 = (this->FileScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar3 = (this->FileScopes).
            super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppSVar5 == ppSVar3) {
      ppcVar4 = (this->ProcessScope).Locks.
                super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppcVar4 ==
          (this->ProcessScope).Locks.super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar2 = false;
      }
      else {
        do {
          ppcVar6 = ppcVar4 + 1;
          bVar2 = cmFileLock::IsLocked(*ppcVar4,filename);
          if (bVar2) {
            return bVar2;
          }
          ppcVar4 = ppcVar6;
        } while (ppcVar6 !=
                 (this->ProcessScope).Locks.
                 super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      return bVar2;
    }
    pSVar1 = *ppSVar5;
    ppcVar4 = (pSVar1->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppcVar4 !=
        (pSVar1->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        bVar2 = cmFileLock::IsLocked(*ppcVar4,filename);
        if (bVar2) {
          return true;
        }
        ppcVar4 = ppcVar4 + 1;
      } while (ppcVar4 !=
               (pSVar1->Locks).super__Vector_base<cmFileLock_*,_std::allocator<cmFileLock_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
      ppSVar3 = (this->FileScopes).
                super__Vector_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    ppSVar5 = ppSVar5 + 1;
  } while( true );
}

Assistant:

bool cmFileLockPool::IsAlreadyLocked(const std::string& filename) const
{
  for (CIt i = this->FunctionScopes.begin(); i != this->FunctionScopes.end();
       ++i) {
    const bool result = (*i)->IsAlreadyLocked(filename);
    if (result) {
      return true;
    }
  }

  for (CIt i = this->FileScopes.begin(); i != this->FileScopes.end(); ++i) {
    const bool result = (*i)->IsAlreadyLocked(filename);
    if (result) {
      return true;
    }
  }

  return this->ProcessScope.IsAlreadyLocked(filename);
}